

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenStructMutator
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  BaseType BVar1;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
  BVar1 = (field->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (struct_def->fixed == true) {
      MutateScalarFieldOfStruct(this,struct_def,field,code_ptr);
      return;
    }
    MutateScalarFieldOfTable(this,struct_def,field,code_ptr);
    return;
  }
  if (((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) &&
     ((field->value).type.element - BASE_TYPE_UTYPE < 0xc)) {
    MutateElementOfVectorOfNonStruct(this,struct_def,field,code_ptr);
    return;
  }
  return;
}

Assistant:

void GenStructMutator(const StructDef &struct_def, const FieldDef &field,
                        std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "");
    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        MutateScalarFieldOfStruct(struct_def, field, code_ptr);
      } else {
        MutateScalarFieldOfTable(struct_def, field, code_ptr);
      }
    } else if (IsVector(field.value.type)) {
      if (IsScalar(field.value.type.element)) {
        MutateElementOfVectorOfNonStruct(struct_def, field, code_ptr);
      }
    }
  }